

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_attribute.c
# Opt level: O1

attribute_conflict
attribute_create(klass cls,char *name,type t,attribute_impl impl,class_visibility_id visibility,
                attribute_impl_interface_singleton singleton)

{
  attribute_conflict paVar1;
  size_t sVar2;
  char *__dest;
  attribute_interface paVar3;
  
  paVar1 = (attribute_conflict)malloc(0x30);
  if (paVar1 == (attribute_conflict)0x0) {
    paVar1 = (attribute_conflict)0x0;
  }
  else {
    if (name == (char *)0x0) {
      paVar1->name = (char *)0x0;
    }
    else {
      sVar2 = strlen(name);
      __dest = (char *)malloc(sVar2 + 1);
      paVar1->name = __dest;
      if (__dest != (char *)0x0) {
        memcpy(__dest,name,sVar2 + 1);
      }
    }
    paVar1->cls = cls;
    paVar1->t = t;
    paVar1->impl = impl;
    paVar1->visibility = visibility;
    if (singleton == (attribute_impl_interface_singleton)0x0) {
      paVar3 = (attribute_interface)0x0;
    }
    else {
      paVar3 = (*singleton)();
    }
    paVar1->iface = paVar3;
  }
  return paVar1;
}

Assistant:

attribute attribute_create(klass cls, const char *name, type t, attribute_impl impl, enum class_visibility_id visibility, attribute_impl_interface_singleton singleton)
{
	attribute attr = malloc(sizeof(struct attribute_type));

	if (attr == NULL)
	{
		return NULL;
	}

	if (name != NULL)
	{
		size_t size = strlen(name) + 1;

		attr->name = malloc(sizeof(char) * size);

		if (attr->name != NULL)
		{
			memcpy(attr->name, name, size);
		}
	}
	else
	{
		attr->name = NULL;
	}

	attr->cls = cls;
	attr->t = t;
	attr->impl = impl;
	attr->visibility = visibility;
	attr->iface = singleton ? singleton() : NULL;

	return attr;
}